

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O1

int secp256k1_ecdsa_sig_sign
              (secp256k1_ecmult_gen_context *ctx,secp256k1_scalar *sigr,secp256k1_scalar *sigs,
              secp256k1_scalar *seckey,secp256k1_scalar *message,secp256k1_scalar *nonce,int *recid)

{
  long lVar1;
  secp256k1_fe *r_00;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  bool bVar10;
  uint uVar11;
  undefined4 extraout_EAX;
  int iVar12;
  int iVar13;
  uint flag;
  int extraout_EAX_00;
  long lVar14;
  long lVar15;
  secp256k1_scalar *b_00;
  byte bVar16;
  secp256k1_gej *r_01;
  secp256k1_fe *psVar17;
  secp256k1_ge *r_02;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  int overflow;
  secp256k1_ge r;
  secp256k1_scalar n;
  uchar b [32];
  secp256k1_gej rp;
  undefined1 auStack_2f0 [16];
  undefined1 auStack_2e0 [16];
  undefined1 auStack_2d0 [16];
  undefined1 auStack_2c0 [16];
  secp256k1_fe *psStack_2b0;
  secp256k1_fe *psStack_2a8;
  undefined1 auStack_2a0 [16];
  undefined1 auStack_290 [16];
  uint64_t uStack_280;
  undefined8 uStack_278;
  undefined1 auStack_270 [16];
  undefined1 auStack_260 [16];
  undefined4 uStack_250;
  undefined1 auStack_240 [32];
  secp256k1_ge sStack_220;
  secp256k1_scalar *psStack_1b8;
  secp256k1_fe *psStack_1b0;
  ulong uStack_1a8;
  secp256k1_scalar *psStack_1a0;
  secp256k1_scalar *psStack_198;
  code *pcStack_190;
  uint local_184;
  secp256k1_scalar *local_180;
  secp256k1_scalar *local_178;
  secp256k1_ge local_170;
  secp256k1_scalar local_108;
  undefined1 local_e8 [184];
  
  local_184 = 0;
  pcStack_190 = (code *)0x143981;
  local_180 = seckey;
  local_178 = message;
  secp256k1_ecmult_gen(ctx,(secp256k1_gej *)(local_e8 + 0x20),nonce);
  pcStack_190 = (code *)0x143991;
  secp256k1_ge_set_gej(&local_170,(secp256k1_gej *)(local_e8 + 0x20));
  pcStack_190 = (code *)0x143999;
  secp256k1_fe_normalize(&local_170.x);
  r_00 = &local_170.y;
  pcStack_190 = (code *)0x1439a6;
  secp256k1_fe_normalize(r_00);
  r_01 = (secp256k1_gej *)local_e8;
  pcStack_190 = (code *)0x1439c1;
  secp256k1_fe_get_b32((uchar *)r_01,&local_170.x);
  pcStack_190 = (code *)0x1439d1;
  secp256k1_scalar_set_b32(sigr,(uchar *)r_01,(int *)&local_184);
  uVar11 = local_184;
  if (recid != (int *)0x0) {
    uVar19 = (ulong)local_184;
    pcStack_190 = (code *)0x1439e6;
    psVar17 = r_00;
    secp256k1_fe_verify(r_00);
    if (local_170.y.normalized == 0) {
      pcStack_190 = secp256k1_ecmult_gen;
      secp256k1_ecdsa_sig_sign_cold_1();
      pcStack_190 = (code *)recid;
      auStack_260 = (undefined1  [16])0x0;
      auStack_270 = (undefined1  [16])0x0;
      uStack_250 = 0;
      auStack_2f0 = (undefined1  [16])0x0;
      auStack_2e0 = (undefined1  [16])0x0;
      auStack_2d0 = (undefined1  [16])0x0;
      auStack_2c0 = (undefined1  [16])0x0;
      psStack_1b8 = sigs;
      psStack_1b0 = r_00;
      uStack_1a8 = uVar19;
      psStack_1a0 = sigr;
      psStack_198 = nonce;
      secp256k1_scalar_add
                ((secp256k1_scalar *)auStack_240,(secp256k1_scalar *)(psVar17->n + 1),b_00);
      bVar16 = 0;
      uVar19 = 0;
      do {
        secp256k1_scalar_verify((secp256k1_scalar *)auStack_240);
        *(int *)(auStack_270 + uVar19 * 4) =
             (int)(*(ulong *)(auStack_240 + (uVar19 >> 1 & 0x7fffffff) * 8) >> (bVar16 & 0x20));
        uVar19 = uVar19 + 1;
        bVar16 = bVar16 + 0x20;
      } while (uVar19 != 8);
      auStack_240._16_16_ = (undefined1  [16])0x0;
      auStack_240._0_16_ = (undefined1  [16])0x0;
      lVar20 = 0x287f00;
      psStack_2b0 = psVar17 + 3;
      bVar10 = true;
      lVar15 = 0;
      iVar12 = 0;
      psStack_2a8 = psVar17;
      do {
        r_02 = &sStack_220;
        iVar13 = 0;
        uVar11 = 0;
        do {
          bVar5 = (byte)(iVar13 + iVar12) & 0x1f;
          bVar16 = (byte)iVar13 & 0x1f;
          uVar11 = (*(uint *)(auStack_270 + (ulong)((uint)(iVar13 + iVar12) >> 5) * 4) >> bVar5 |
                   *(uint *)(auStack_270 + (ulong)((uint)(iVar13 + iVar12) >> 5) * 4) <<
                   0x20 - bVar5) << ((byte)iVar13 & 0x1f) ^
                   uVar11 & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
          iVar13 = iVar13 + 1;
        } while (iVar13 != 6);
        flag = uVar11 >> 5 & 1;
        uVar19 = 0;
        do {
          uVar18 = (uint)(((-flag ^ uVar11) & 0x1f) << 6 == uVar19);
          uVar3 = (ulong)((long)r_02 << 3) >> 0x33;
          uVar4 = (((long)r_02 << 3 | (ulong)r_02 >> 0x3d) << 0xd | uVar3) >> 3;
          uVar2 = uVar4 << 0x33;
          lVar1 = (long)(int)uVar18 + -1;
          lVar14 = -(long)(int)uVar18;
          auVar21._8_4_ = (int)lVar1;
          auVar21._0_8_ = lVar1;
          auVar21._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar24._8_4_ = (int)lVar14;
          auVar24._0_8_ = lVar14;
          auVar24._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auStack_2f0 = *(undefined1 (*) [16])(lVar20 + -0x30 + uVar19) & auVar24 |
                        auStack_2f0 & auVar21;
          auStack_2e0 = auVar24 & *(undefined1 (*) [16])(lVar20 + -0x20 + uVar19) |
                        auVar21 & auStack_2e0;
          uVar3 = (uVar2 | (uVar3 << 0x3d | uVar4) >> 0xd) << 3;
          uVar4 = uVar3 >> 0x33;
          uVar2 = ((uVar3 | uVar2 >> 0x3d) << 0xd | uVar4) >> 3;
          r_02 = (secp256k1_ge *)(uVar2 << 0x33 | (uVar4 << 0x3d | uVar2) >> 0xd);
          lVar1 = (long)(int)uVar18 + -1;
          lVar14 = -(long)(int)uVar18;
          auVar22._8_4_ = (int)lVar1;
          auVar22._0_8_ = lVar1;
          auVar22._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar25._8_4_ = (int)lVar14;
          auVar25._0_8_ = lVar14;
          auVar25._12_4_ = (int)((ulong)lVar14 >> 0x20);
          auStack_2d0 = *(undefined1 (*) [16])(lVar20 + -0x10 + uVar19) & auVar25 |
                        auStack_2d0 & auVar22;
          auStack_2c0 = auVar25 & *(undefined1 (*) [16])(lVar20 + uVar19) | auVar22 & auStack_2c0;
          uVar19 = uVar19 + 0x40;
        } while (uVar19 != 0x800);
        secp256k1_ge_from_storage(r_02,(secp256k1_ge_storage *)auStack_2f0);
        secp256k1_fe_verify(&sStack_220.y);
        secp256k1_fe_verify_magnitude(&sStack_220.y,1);
        auStack_2a0._8_8_ = 0x3ffffffffffffc - sStack_220.y.n[1];
        auStack_2a0._0_8_ = 0x3ffffbfffff0bc - sStack_220.y.n[0];
        auStack_290._8_8_ = 0x3ffffffffffffc - sStack_220.y.n[3];
        auStack_290._0_8_ = 0x3ffffffffffffc - sStack_220.y.n[2];
        uStack_280 = 0x3fffffffffffc - sStack_220.y.n[4];
        uStack_278._0_4_ = 2;
        uStack_278._4_4_ = 0;
        secp256k1_fe_verify((secp256k1_fe *)auStack_2a0);
        secp256k1_fe_cmov(&sStack_220.y,(secp256k1_fe *)auStack_2a0,flag);
        if (bVar10) {
          secp256k1_gej_set_ge(r_01,&sStack_220);
          secp256k1_gej_rescale(r_01,psStack_2b0);
          bVar10 = false;
        }
        else {
          secp256k1_gej_add_ge(r_01,r_01,&sStack_220);
        }
        iVar12 = iVar12 + 6;
        lVar15 = lVar15 + 1;
        lVar20 = lVar20 + 0x800;
      } while (lVar15 != 0x2b);
      secp256k1_gej_add_ge(r_01,r_01,(secp256k1_ge *)&psStack_2a8->magnitude);
      uStack_278._0_4_ = 0;
      uStack_278._4_4_ = 1;
      auStack_2a0 = (undefined1  [16])0x0;
      auStack_290 = (undefined1  [16])0x0;
      uStack_280 = 0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_2a0);
      secp256k1_ge_clear(&sStack_220);
      return extraout_EAX_00;
    }
    *recid = ((uint)local_170.y.n[0] & 1) + uVar11 * 2;
  }
  pcStack_190 = (code *)0x143a1a;
  secp256k1_scalar_mul(&local_108,sigr,local_180);
  pcStack_190 = (code *)0x143a2a;
  secp256k1_scalar_add(&local_108,&local_108,local_178);
  pcStack_190 = (code *)0x143a35;
  secp256k1_scalar_inverse(sigs,nonce);
  pcStack_190 = (code *)0x143a43;
  secp256k1_scalar_mul(sigs,sigs,&local_108);
  local_108.d[2] = 0;
  local_108.d[3] = 0;
  local_108.d[0] = 0;
  local_108.d[1] = 0;
  pcStack_190 = (code *)0x143a5e;
  secp256k1_gej_clear((secp256k1_gej *)(local_e8 + 0x20));
  pcStack_190 = (code *)0x143a68;
  secp256k1_ge_clear(&local_170);
  pcStack_190 = (code *)0x143a70;
  uVar11 = secp256k1_scalar_is_high(sigs);
  pcStack_190 = (code *)0x143a7c;
  secp256k1_scalar_cond_negate(sigs,uVar11);
  if (recid != (int *)0x0) {
    *recid = *recid ^ uVar11;
  }
  pcStack_190 = (code *)0x143a8d;
  secp256k1_scalar_verify(sigr);
  uVar6 = sigr->d[0];
  uVar7 = sigr->d[1];
  uVar8 = sigr->d[2];
  uVar9 = sigr->d[3];
  pcStack_190 = (code *)0x143ab9;
  secp256k1_scalar_verify(sigs);
  auVar23._0_4_ = -(uint)((int)sigs->d[2] == 0 && (int)sigs->d[0] == 0);
  auVar23._4_4_ = -(uint)(*(int *)((long)sigs->d + 0x14) == 0 && *(int *)((long)sigs->d + 4) == 0);
  auVar23._8_4_ = -(uint)((int)sigs->d[3] == 0 && (int)sigs->d[1] == 0);
  auVar23._12_4_ =
       -(uint)(*(int *)((long)sigs->d + 0x1c) == 0 && *(int *)((long)sigs->d + 0xc) == 0);
  iVar12 = movmskps(extraout_EAX,auVar23);
  return (int)(iVar12 != 0xf && ((uVar9 != 0 || uVar7 != 0) || (uVar8 != 0 || uVar6 != 0)));
}

Assistant:

static int secp256k1_ecdsa_sig_sign(const secp256k1_ecmult_gen_context *ctx, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_scalar *seckey, const secp256k1_scalar *message, const secp256k1_scalar *nonce, int *recid) {
    unsigned char b[32];
    secp256k1_gej rp;
    secp256k1_ge r;
    secp256k1_scalar n;
    int overflow = 0;
    int high;

    secp256k1_ecmult_gen(ctx, &rp, nonce);
    secp256k1_ge_set_gej(&r, &rp);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_normalize(&r.y);
    secp256k1_fe_get_b32(b, &r.x);
    secp256k1_scalar_set_b32(sigr, b, &overflow);
    if (recid) {
        /* The overflow condition is cryptographically unreachable as hitting it requires finding the discrete log
         * of some P where P.x >= order, and only 1 in about 2^127 points meet this criteria.
         */
        *recid = (overflow << 1) | secp256k1_fe_is_odd(&r.y);
    }
    secp256k1_scalar_mul(&n, sigr, seckey);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, nonce);
    secp256k1_scalar_mul(sigs, sigs, &n);
    secp256k1_scalar_clear(&n);
    secp256k1_gej_clear(&rp);
    secp256k1_ge_clear(&r);
    high = secp256k1_scalar_is_high(sigs);
    secp256k1_scalar_cond_negate(sigs, high);
    if (recid) {
        *recid ^= high;
    }
    /* P.x = order is on the curve, so technically sig->r could end up being zero, which would be an invalid signature.
     * This is cryptographically unreachable as hitting it requires finding the discrete log of P.x = N.
     */
    return (int)(!secp256k1_scalar_is_zero(sigr)) & (int)(!secp256k1_scalar_is_zero(sigs));
}